

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_StopMusic(bool force)

{
  bool bVar1;
  bool force_local;
  
  if ((force) || (PlayList == (FPlayList *)0x0)) {
    bVar1 = FString::IsEmpty(&mus_playing.name);
    if (!bVar1) {
      if (mus_playing.handle != (MusInfo *)0x0) {
        if ((MusicPaused & 1U) != 0) {
          (*(mus_playing.handle)->_vptr_MusInfo[6])();
        }
        (*(mus_playing.handle)->_vptr_MusInfo[7])();
        if (mus_playing.handle != (MusInfo *)0x0) {
          (*(mus_playing.handle)->_vptr_MusInfo[1])();
        }
        mus_playing.handle = (MusInfo *)0x0;
      }
      FString::operator=(&LastSong,&mus_playing.name);
      FString::operator=(&mus_playing.name,"");
    }
  }
  return;
}

Assistant:

void S_StopMusic (bool force)
{
	// [RH] Don't stop if a playlist is active.
	if ((force || PlayList == NULL) && !mus_playing.name.IsEmpty())
	{
		if (mus_playing.handle != NULL)
		{
			if (MusicPaused)
				mus_playing.handle->Resume();

			mus_playing.handle->Stop();
			delete mus_playing.handle;
			mus_playing.handle = NULL;
		}
		LastSong = mus_playing.name;
		mus_playing.name = "";
	}
}